

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this,ON_BrepFace *F)

{
  int iVar1;
  ON_BrepLoop *pOVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  ON_SimpleArray<int> li;
  ON_SimpleArray<int> local_30;
  
  local_30._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_30.m_a = (int *)0x0;
  local_30.m_count = 0;
  local_30.m_capacity = 0;
  ON_SimpleArray<int>::operator=(&local_30,&F->m_li);
  if (local_30.m_count < 1) {
    bVar5 = false;
  }
  else {
    lVar6 = 0;
    bVar5 = false;
    iVar4 = local_30.m_count;
    do {
      iVar1 = local_30.m_a[lVar6];
      pOVar2 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      if (pOVar2[iVar1].m_loop_index == iVar1) {
        bVar3 = RemoveSlits(this,pOVar2 + iVar1);
        bVar5 = (bool)(bVar5 | bVar3);
        iVar4 = local_30.m_count;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  ON_SimpleArray<int>::~ON_SimpleArray(&local_30);
  return bVar5;
}

Assistant:

bool ON_Brep::RemoveSlits(ON_BrepFace& F)

{
  int i;
  bool rc = false;
  ON_SimpleArray<int> li = F.m_li;
  for (i=0; i<li.Count(); i++){
    ON_BrepLoop& L = m_L[li[i]];
    if (L.m_loop_index != li[i]) 
      continue;
    if (RemoveSlits(L))
      rc = true;
  }
  return rc;
}